

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::AddUtility(cmTarget *this,string *u,cmMakefile *makefile)

{
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  cmListFileBacktrace local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  local_80;
  
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->Utilities,u);
  if ((makefile != (cmMakefile *)0x0) &&
     (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    cmMakefile::GetBacktrace(&local_c0,makefile);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
    ::pair<cmListFileBacktrace,_true>(&local_80,u,&local_c0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmListFileBacktrace>,std::_Select1st<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,cmListFileBacktrace>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmListFileBacktrace>,std::_Select1st<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>>
                *)&this->UtilityBacktraces,&local_80);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
    ::~pair(&local_80);
    cmListFileBacktrace::~cmListFileBacktrace(&local_c0);
  }
  return;
}

Assistant:

void cmTarget::AddUtility(const std::string& u, cmMakefile *makefile)
{
  if(this->Utilities.insert(u).second && makefile)
    {
    this->UtilityBacktraces.insert(
            std::make_pair(u, makefile->GetBacktrace()));
    }
}